

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::vector<Token,_std::allocator<Token>_>_> * __thiscall
Parser::extractMacroParameter
          (optional<std::vector<Token,_std::allocator<Token>_>_> *__return_storage_ptr__,
          Parser *this,Token *macroStart)

{
  TokenType TVar1;
  pointer pFVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Token *pTVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  vector<Token,_std::allocator<Token>_> tokens;
  vector<Token,_std::allocator<Token>_> local_58;
  TokenizerPosition local_38;
  
  local_38.it._M_node =
       (iterator)
       (((this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  iVar10 = 0;
  iVar11 = 0;
  iVar9 = 0;
  do {
    pTVar8 = Tokenizer::peekToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    if (pTVar8->type == Separator) break;
    pTVar8 = Tokenizer::peekToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    TVar1 = pTVar8->type;
    bVar3 = iVar9 != 0;
    bVar4 = iVar11 != 0;
    bVar12 = iVar10 != 0;
    iVar5 = 0;
    iVar6 = 0;
    iVar7 = 0;
    if (((bVar3 || bVar4) || TVar1 != Comma) || bVar12) {
      switch(TVar1) {
      case LBrack:
        iVar10 = iVar10 + 1;
        break;
      case RBrack:
        iVar10 = iVar10 + -1;
        break;
      case Comma:
      case Assign:
      case Equ:
      case EquValue:
      case Hash:
        break;
      case LBrace:
        iVar11 = iVar11 + 1;
        break;
      case RBrace:
        iVar11 = iVar11 + -1;
        break;
      default:
        if (TVar1 == RParen) {
          iVar9 = iVar9 + -1;
        }
        else if (TVar1 == LParen) {
          iVar9 = iVar9 + 1;
        }
      }
      Tokenizer::eatTokens
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
      iVar5 = iVar11;
      iVar6 = iVar10;
      iVar7 = iVar9;
    }
    iVar9 = iVar7;
    iVar10 = iVar6;
    iVar11 = iVar5;
  } while (((bVar3 || bVar4) || TVar1 != Comma) || bVar12);
  if (iVar9 == 0) {
    pFVar2 = (this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    Tokenizer::getTokens
              (&local_58,pFVar2[-1].tokenizer,local_38,
               (TokenizerPosition)((pFVar2[-1].tokenizer)->position).it._M_node);
    bVar12 = local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish ==
             local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar12) {
      printError<>(this,macroStart,"Empty macro argument");
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
        super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
        super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload.
        _M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl =
           local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>).
               _M_payload.
               super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload
               ._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl + 8) =
           local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>).
               _M_payload.
               super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload
               ._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl + 0x10) =
           local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
    super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = !bVar12;
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_58);
  }
  else {
    printError<>(this,macroStart,"Unbalanced parentheses in macro parameter");
    (__return_storage_ptr__->
    super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
    super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Token>> Parser::extractMacroParameter(const Token &macroStart)
{
	TokenizerPosition startPos = getTokenizer()->getPosition();

	// Find the end of the parameter. The parameter may contain expressions with function calls,
	// so keep track of the current parenthesis depth level
	int parenCount = 0;
	int braceCount = 0;
	int bracketCount = 0;

	while (peekToken().type != TokenType::Separator)
	{
		// if the next token is a comma, only exit the loop if parentheses are balanced
		auto type = peekToken().type;
		if (type == TokenType::Comma && parenCount == 0 && braceCount == 0 && bracketCount == 0)
			break;

		// keep track of parenthesis depth
		switch (type)
		{
		case TokenType::LParen:
			++parenCount;
			break;
		case TokenType::RParen:
			--parenCount;
			break;
		case TokenType::LBrace:
			++braceCount;
			break;
		case TokenType::RBrace:
			--braceCount;
			break;
		case TokenType::LBrack:
			++bracketCount;
			break;
		case TokenType::RBrack:
			--bracketCount;
			break;
		default:
			break;
		}

		eatToken();
	}

	if (parenCount != 0)
	{
		printError(macroStart, "Unbalanced parentheses in macro parameter");
		return std::nullopt;
	}

	TokenizerPosition endPos = getTokenizer()->getPosition();
	std::vector<Token> tokens = getTokenizer()->getTokens(startPos,endPos);
	if (tokens.size() == 0)
	{
		printError(macroStart, "Empty macro argument");
		return std::nullopt;
	}

	return tokens;
}